

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O3

void idct32_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  __m256i alVar11;
  __m256i alVar12;
  __m256i alVar13;
  __m256i alVar14;
  __m256i alVar15;
  __m256i alVar16;
  __m256i alVar17;
  __m256i alVar18;
  __m256i alVar19;
  __m256i alVar20;
  __m256i alVar21;
  __m256i alVar22;
  undefined1 auVar23 [32];
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  byte bVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  longlong local_540;
  longlong lStack_538;
  longlong lStack_530;
  longlong lStack_528;
  longlong local_520;
  longlong lStack_518;
  longlong lStack_510;
  longlong lStack_508;
  longlong local_500;
  longlong lStack_4f8;
  longlong lStack_4f0;
  longlong lStack_4e8;
  longlong local_4e0;
  longlong lStack_4d8;
  longlong lStack_4d0;
  longlong lStack_4c8;
  longlong local_3a0;
  longlong lStack_398;
  longlong lStack_390;
  longlong lStack_388;
  int local_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  
  lVar30 = (long)bit * 0x100;
  iVar34 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x228);
  iVar27 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x1a8);
  iVar28 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x1e8);
  iVar32 = -iVar34;
  iVar24 = -iVar27;
  iVar25 = -iVar28;
  iVar31 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x168);
  iVar33 = 1 << ((char)bit - 1U & 0x1f);
  iVar26 = -iVar31;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 600);
  auVar61._4_4_ = uVar1;
  auVar61._0_4_ = uVar1;
  auVar61._8_4_ = uVar1;
  auVar61._12_4_ = uVar1;
  auVar61._16_4_ = uVar1;
  auVar61._20_4_ = uVar1;
  auVar61._24_4_ = uVar1;
  auVar61._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 0x1d8);
  auVar64._4_4_ = uVar1;
  auVar64._0_4_ = uVar1;
  auVar64._8_4_ = uVar1;
  auVar64._12_4_ = uVar1;
  auVar64._16_4_ = uVar1;
  auVar64._20_4_ = uVar1;
  auVar64._24_4_ = uVar1;
  auVar64._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 0x218);
  auVar68._4_4_ = uVar1;
  auVar68._0_4_ = uVar1;
  auVar68._8_4_ = uVar1;
  auVar68._12_4_ = uVar1;
  auVar68._16_4_ = uVar1;
  auVar68._20_4_ = uVar1;
  auVar68._24_4_ = uVar1;
  auVar68._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 0x198);
  auVar73._4_4_ = uVar1;
  auVar73._0_4_ = uVar1;
  auVar73._8_4_ = uVar1;
  auVar73._12_4_ = uVar1;
  auVar73._16_4_ = uVar1;
  auVar73._20_4_ = uVar1;
  auVar73._24_4_ = uVar1;
  auVar73._28_4_ = uVar1;
  auVar58._4_4_ = iVar32;
  auVar58._0_4_ = iVar32;
  auVar58._8_4_ = iVar32;
  auVar58._12_4_ = iVar32;
  auVar58._16_4_ = iVar32;
  auVar58._20_4_ = iVar32;
  auVar58._24_4_ = iVar32;
  auVar58._28_4_ = iVar32;
  auVar67._4_4_ = iVar24;
  auVar67._0_4_ = iVar24;
  auVar67._8_4_ = iVar24;
  auVar67._12_4_ = iVar24;
  auVar67._16_4_ = iVar24;
  auVar67._20_4_ = iVar24;
  auVar67._24_4_ = iVar24;
  auVar67._28_4_ = iVar24;
  auVar77._4_4_ = iVar25;
  auVar77._0_4_ = iVar25;
  auVar77._8_4_ = iVar25;
  auVar77._12_4_ = iVar25;
  auVar77._16_4_ = iVar25;
  auVar77._20_4_ = iVar25;
  auVar77._24_4_ = iVar25;
  auVar77._28_4_ = iVar25;
  auVar80._4_4_ = iVar26;
  auVar80._0_4_ = iVar26;
  auVar80._8_4_ = iVar26;
  auVar80._12_4_ = iVar26;
  auVar80._16_4_ = iVar26;
  auVar80._20_4_ = iVar26;
  auVar80._24_4_ = iVar26;
  auVar80._28_4_ = iVar26;
  auVar60._4_4_ = iVar33;
  auVar60._0_4_ = iVar33;
  auVar60._8_4_ = iVar33;
  auVar60._12_4_ = iVar33;
  auVar60._16_4_ = iVar33;
  auVar60._20_4_ = iVar33;
  auVar60._24_4_ = iVar33;
  auVar60._28_4_ = iVar33;
  auVar23 = vpmulld_avx2((undefined1  [32])in[1],auVar61);
  auVar80 = vpmulld_avx2((undefined1  [32])in[0x1f],auVar80);
  auVar23 = vpaddd_avx2(auVar23,auVar60);
  auVar23 = vpaddd_avx2(auVar23,auVar80);
  auVar80 = vpmulld_avx2((undefined1  [32])in[0x11],auVar64);
  auVar77 = vpmulld_avx2((undefined1  [32])in[0xf],auVar77);
  auVar80 = vpaddd_avx2(auVar80,auVar60);
  auVar80 = vpaddd_avx2(auVar80,auVar77);
  auVar77 = vpmulld_avx2((undefined1  [32])in[9],auVar68);
  auVar67 = vpmulld_avx2((undefined1  [32])in[0x17],auVar67);
  auVar77 = vpaddd_avx2(auVar77,auVar60);
  auVar77 = vpaddd_avx2(auVar77,auVar67);
  auVar49 = vpmulld_avx2((undefined1  [32])in[7],auVar58);
  auVar67 = vpmulld_avx2((undefined1  [32])in[0x19],auVar73);
  auVar67 = vpaddd_avx2(auVar67,auVar60);
  auVar67 = vpaddd_avx2(auVar67,auVar49);
  iVar24 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x188);
  iVar25 = -iVar24;
  auVar49._4_4_ = iVar25;
  auVar49._0_4_ = iVar25;
  auVar49._8_4_ = iVar25;
  auVar49._12_4_ = iVar25;
  auVar49._16_4_ = iVar25;
  auVar49._20_4_ = iVar25;
  auVar49._24_4_ = iVar25;
  auVar49._28_4_ = iVar25;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 0x238);
  auVar74._4_4_ = uVar1;
  auVar74._0_4_ = uVar1;
  auVar74._8_4_ = uVar1;
  auVar74._12_4_ = uVar1;
  auVar74._16_4_ = uVar1;
  auVar74._20_4_ = uVar1;
  auVar74._24_4_ = uVar1;
  auVar74._28_4_ = uVar1;
  auVar50 = vpmulld_avx2((undefined1  [32])in[0x1b],auVar49);
  auVar49 = vpmulld_avx2((undefined1  [32])in[5],auVar74);
  auVar49 = vpaddd_avx2(auVar49,auVar60);
  auVar49 = vpaddd_avx2(auVar49,auVar50);
  iVar25 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x208);
  iVar26 = -iVar25;
  auVar50._4_4_ = iVar26;
  auVar50._0_4_ = iVar26;
  auVar50._8_4_ = iVar26;
  auVar50._12_4_ = iVar26;
  auVar50._16_4_ = iVar26;
  auVar50._20_4_ = iVar26;
  auVar50._24_4_ = iVar26;
  auVar50._28_4_ = iVar26;
  auVar58 = vpmulld_avx2((undefined1  [32])in[0xb],auVar50);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 0x1b8);
  auVar65._4_4_ = uVar1;
  auVar65._0_4_ = uVar1;
  auVar65._8_4_ = uVar1;
  auVar65._12_4_ = uVar1;
  auVar65._16_4_ = uVar1;
  auVar65._20_4_ = uVar1;
  auVar65._24_4_ = uVar1;
  auVar65._28_4_ = uVar1;
  auVar50 = vpmulld_avx2((undefined1  [32])in[0x15],auVar65);
  auVar50 = vpaddd_avx2(auVar50,auVar60);
  auVar50 = vpaddd_avx2(auVar50,auVar58);
  iVar26 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x1c8);
  iVar32 = -iVar26;
  auVar85._4_4_ = iVar32;
  auVar85._0_4_ = iVar32;
  auVar85._8_4_ = iVar32;
  auVar85._12_4_ = iVar32;
  auVar85._16_4_ = iVar32;
  auVar85._20_4_ = iVar32;
  auVar85._24_4_ = iVar32;
  auVar85._28_4_ = iVar32;
  auVar85 = vpmulld_avx2((undefined1  [32])in[0x13],auVar85);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 0x1f8);
  auVar57._4_4_ = uVar1;
  auVar57._0_4_ = uVar1;
  auVar57._8_4_ = uVar1;
  auVar57._12_4_ = uVar1;
  auVar57._16_4_ = uVar1;
  auVar57._20_4_ = uVar1;
  auVar57._24_4_ = uVar1;
  auVar57._28_4_ = uVar1;
  auVar58 = vpmulld_avx2((undefined1  [32])in[0xd],auVar57);
  auVar58 = vpaddd_avx2(auVar58,auVar60);
  auVar58 = vpaddd_avx2(auVar58,auVar85);
  iVar32 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x248);
  iVar33 = -iVar32;
  auVar86._4_4_ = iVar33;
  auVar86._0_4_ = iVar33;
  auVar86._8_4_ = iVar33;
  auVar86._12_4_ = iVar33;
  auVar86._16_4_ = iVar33;
  auVar86._20_4_ = iVar33;
  auVar86._24_4_ = iVar33;
  auVar86._28_4_ = iVar33;
  auVar78 = vpmulld_avx2((undefined1  [32])in[3],auVar86);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 0x178);
  auVar51._4_4_ = uVar1;
  auVar51._0_4_ = uVar1;
  auVar51._8_4_ = uVar1;
  auVar51._12_4_ = uVar1;
  auVar51._16_4_ = uVar1;
  auVar51._20_4_ = uVar1;
  auVar51._24_4_ = uVar1;
  auVar51._28_4_ = uVar1;
  auVar85 = vpmulld_avx2((undefined1  [32])in[0x1d],auVar51);
  auVar85 = vpaddd_avx2(auVar85,auVar60);
  auVar85 = vpaddd_avx2(auVar85,auVar78);
  auVar78._4_4_ = iVar32;
  auVar78._0_4_ = iVar32;
  auVar78._8_4_ = iVar32;
  auVar78._12_4_ = iVar32;
  auVar78._16_4_ = iVar32;
  auVar78._20_4_ = iVar32;
  auVar78._24_4_ = iVar32;
  auVar78._28_4_ = iVar32;
  auVar78 = vpmulld_avx2((undefined1  [32])in[0x1d],auVar78);
  auVar36 = vpmulld_avx2((undefined1  [32])in[3],auVar51);
  auVar78 = vpaddd_avx2(auVar78,auVar60);
  auVar78 = vpaddd_avx2(auVar78,auVar36);
  auVar36._4_4_ = iVar26;
  auVar36._0_4_ = iVar26;
  auVar36._8_4_ = iVar26;
  auVar36._12_4_ = iVar26;
  auVar36._16_4_ = iVar26;
  auVar36._20_4_ = iVar26;
  auVar36._24_4_ = iVar26;
  auVar36._28_4_ = iVar26;
  auVar36 = vpmulld_avx2((undefined1  [32])in[0xd],auVar36);
  auVar37 = vpmulld_avx2((undefined1  [32])in[0x13],auVar57);
  auVar36 = vpaddd_avx2(auVar36,auVar60);
  auVar36 = vpaddd_avx2(auVar36,auVar37);
  auVar37._4_4_ = iVar25;
  auVar37._0_4_ = iVar25;
  auVar37._8_4_ = iVar25;
  auVar37._12_4_ = iVar25;
  auVar37._16_4_ = iVar25;
  auVar37._20_4_ = iVar25;
  auVar37._24_4_ = iVar25;
  auVar37._28_4_ = iVar25;
  auVar37 = vpmulld_avx2((undefined1  [32])in[0x15],auVar37);
  auVar38 = vpmulld_avx2((undefined1  [32])in[0xb],auVar65);
  auVar37 = vpaddd_avx2(auVar37,auVar60);
  auVar37 = vpaddd_avx2(auVar37,auVar38);
  auVar38._4_4_ = iVar24;
  auVar38._0_4_ = iVar24;
  auVar38._8_4_ = iVar24;
  auVar38._12_4_ = iVar24;
  auVar38._16_4_ = iVar24;
  auVar38._20_4_ = iVar24;
  auVar38._24_4_ = iVar24;
  auVar38._28_4_ = iVar24;
  auVar38 = vpmulld_avx2((undefined1  [32])in[5],auVar38);
  auVar39 = vpmulld_avx2((undefined1  [32])in[0x1b],auVar74);
  auVar38 = vpaddd_avx2(auVar38,auVar60);
  auVar38 = vpaddd_avx2(auVar38,auVar39);
  auVar39._4_4_ = iVar34;
  auVar39._0_4_ = iVar34;
  auVar39._8_4_ = iVar34;
  auVar39._12_4_ = iVar34;
  auVar39._16_4_ = iVar34;
  auVar39._20_4_ = iVar34;
  auVar39._24_4_ = iVar34;
  auVar39._28_4_ = iVar34;
  auVar39 = vpmulld_avx2((undefined1  [32])in[0x19],auVar39);
  auVar40 = vpmulld_avx2(auVar73,(undefined1  [32])in[7]);
  auVar39 = vpaddd_avx2(auVar39,auVar60);
  auVar39 = vpaddd_avx2(auVar39,auVar40);
  auVar40._4_4_ = iVar27;
  auVar40._0_4_ = iVar27;
  auVar40._8_4_ = iVar27;
  auVar40._12_4_ = iVar27;
  auVar40._16_4_ = iVar27;
  auVar40._20_4_ = iVar27;
  auVar40._24_4_ = iVar27;
  auVar40._28_4_ = iVar27;
  auVar40 = vpmulld_avx2(auVar40,(undefined1  [32])in[9]);
  auVar41 = vpmulld_avx2((undefined1  [32])in[0x17],auVar68);
  auVar40 = vpaddd_avx2(auVar40,auVar60);
  auVar40 = vpaddd_avx2(auVar40,auVar41);
  auVar41._4_4_ = iVar28;
  auVar41._0_4_ = iVar28;
  auVar41._8_4_ = iVar28;
  auVar41._12_4_ = iVar28;
  auVar41._16_4_ = iVar28;
  auVar41._20_4_ = iVar28;
  auVar41._24_4_ = iVar28;
  auVar41._28_4_ = iVar28;
  auVar41 = vpmulld_avx2(auVar41,(undefined1  [32])in[0x11]);
  auVar42 = vpmulld_avx2((undefined1  [32])in[0xf],auVar64);
  auVar41 = vpaddd_avx2(auVar41,auVar60);
  auVar41 = vpaddd_avx2(auVar41,auVar42);
  auVar42._4_4_ = iVar31;
  auVar42._0_4_ = iVar31;
  auVar42._8_4_ = iVar31;
  auVar42._12_4_ = iVar31;
  auVar42._16_4_ = iVar31;
  auVar42._20_4_ = iVar31;
  auVar42._24_4_ = iVar31;
  auVar42._28_4_ = iVar31;
  auVar42 = vpmulld_avx2(auVar42,(undefined1  [32])in[1]);
  auVar51 = vpmulld_avx2((undefined1  [32])in[0x1f],auVar61);
  auVar42 = vpaddd_avx2(auVar42,auVar60);
  auVar42 = vpaddd_avx2(auVar42,auVar51);
  iVar34 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x170);
  iVar27 = -iVar34;
  auVar52._4_4_ = iVar27;
  auVar52._0_4_ = iVar27;
  auVar52._8_4_ = iVar27;
  auVar52._12_4_ = iVar27;
  auVar52._16_4_ = iVar27;
  auVar52._20_4_ = iVar27;
  auVar52._24_4_ = iVar27;
  auVar52._28_4_ = iVar27;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 0x250);
  auVar87._4_4_ = uVar1;
  auVar87._0_4_ = uVar1;
  auVar87._8_4_ = uVar1;
  auVar87._12_4_ = uVar1;
  auVar87._16_4_ = uVar1;
  auVar87._20_4_ = uVar1;
  auVar87._24_4_ = uVar1;
  auVar87._28_4_ = uVar1;
  auVar52 = vpmulld_avx2((undefined1  [32])in[0x1e],auVar52);
  auVar51 = vpmulld_avx2((undefined1  [32])in[2],auVar87);
  auVar51 = vpaddd_avx2(auVar51,auVar60);
  auVar51 = vpaddd_avx2(auVar51,auVar52);
  iVar27 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x1f0);
  iVar28 = -iVar27;
  auVar53._4_4_ = iVar28;
  auVar53._0_4_ = iVar28;
  auVar53._8_4_ = iVar28;
  auVar53._12_4_ = iVar28;
  auVar53._16_4_ = iVar28;
  auVar53._20_4_ = iVar28;
  auVar53._24_4_ = iVar28;
  auVar53._28_4_ = iVar28;
  auVar53 = vpmulld_avx2((undefined1  [32])in[0xe],auVar53);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 0x1d0);
  auVar59._4_4_ = uVar1;
  auVar59._0_4_ = uVar1;
  auVar59._8_4_ = uVar1;
  auVar59._12_4_ = uVar1;
  auVar59._16_4_ = uVar1;
  auVar59._20_4_ = uVar1;
  auVar59._24_4_ = uVar1;
  auVar59._28_4_ = uVar1;
  auVar52 = vpmulld_avx2((undefined1  [32])in[0x12],auVar59);
  auVar52 = vpaddd_avx2(auVar52,auVar60);
  auVar52 = vpaddd_avx2(auVar52,auVar53);
  iVar28 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x1b0);
  iVar31 = -iVar28;
  auVar69._4_4_ = iVar31;
  auVar69._0_4_ = iVar31;
  auVar69._8_4_ = iVar31;
  auVar69._12_4_ = iVar31;
  auVar69._16_4_ = iVar31;
  auVar69._20_4_ = iVar31;
  auVar69._24_4_ = iVar31;
  auVar69._28_4_ = iVar31;
  auVar57 = vpmulld_avx2((undefined1  [32])in[0x16],auVar69);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 0x210);
  auVar84._4_4_ = uVar1;
  auVar84._0_4_ = uVar1;
  auVar84._8_4_ = uVar1;
  auVar84._12_4_ = uVar1;
  auVar84._16_4_ = uVar1;
  auVar84._20_4_ = uVar1;
  auVar84._24_4_ = uVar1;
  auVar84._28_4_ = uVar1;
  auVar53 = vpmulld_avx2((undefined1  [32])in[10],auVar84);
  auVar53 = vpaddd_avx2(auVar53,auVar60);
  auVar53 = vpaddd_avx2(auVar53,auVar57);
  iVar31 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x230);
  iVar24 = -iVar31;
  auVar70._4_4_ = iVar24;
  auVar70._0_4_ = iVar24;
  auVar70._8_4_ = iVar24;
  auVar70._12_4_ = iVar24;
  auVar70._16_4_ = iVar24;
  auVar70._20_4_ = iVar24;
  auVar70._24_4_ = iVar24;
  auVar70._28_4_ = iVar24;
  auVar61 = vpmulld_avx2((undefined1  [32])in[6],auVar70);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar30 + 400);
  auVar71._4_4_ = uVar1;
  auVar71._0_4_ = uVar1;
  auVar71._8_4_ = uVar1;
  auVar71._12_4_ = uVar1;
  auVar71._16_4_ = uVar1;
  auVar71._20_4_ = uVar1;
  auVar71._24_4_ = uVar1;
  auVar71._28_4_ = uVar1;
  auVar57 = vpmulld_avx2((undefined1  [32])in[0x1a],auVar71);
  auVar57 = vpaddd_avx2(auVar57,auVar60);
  auVar57 = vpaddd_avx2(auVar57,auVar61);
  auVar81._4_4_ = iVar31;
  auVar81._0_4_ = iVar31;
  auVar81._8_4_ = iVar31;
  auVar81._12_4_ = iVar31;
  auVar81._16_4_ = iVar31;
  auVar81._20_4_ = iVar31;
  auVar81._24_4_ = iVar31;
  auVar81._28_4_ = iVar31;
  auVar61 = vpmulld_avx2((undefined1  [32])in[0x1a],auVar81);
  auVar43 = vpmulld_avx2((undefined1  [32])in[6],auVar71);
  auVar61 = vpaddd_avx2(auVar61,auVar60);
  auVar61 = vpaddd_avx2(auVar61,auVar43);
  auVar43._4_4_ = iVar28;
  auVar43._0_4_ = iVar28;
  auVar43._8_4_ = iVar28;
  auVar43._12_4_ = iVar28;
  auVar43._16_4_ = iVar28;
  auVar43._20_4_ = iVar28;
  auVar43._24_4_ = iVar28;
  auVar43._28_4_ = iVar28;
  auVar43 = vpmulld_avx2((undefined1  [32])in[10],auVar43);
  auVar44 = vpmulld_avx2((undefined1  [32])in[0x16],auVar84);
  auVar43 = vpaddd_avx2(auVar43,auVar60);
  auVar43 = vpaddd_avx2(auVar43,auVar44);
  auVar44._4_4_ = iVar27;
  auVar44._0_4_ = iVar27;
  auVar44._8_4_ = iVar27;
  auVar44._12_4_ = iVar27;
  auVar44._16_4_ = iVar27;
  auVar44._20_4_ = iVar27;
  auVar44._24_4_ = iVar27;
  auVar44._28_4_ = iVar27;
  auVar44 = vpmulld_avx2((undefined1  [32])in[0x12],auVar44);
  auVar45 = vpmulld_avx2((undefined1  [32])in[0xe],auVar59);
  auVar44 = vpaddd_avx2(auVar44,auVar60);
  auVar44 = vpaddd_avx2(auVar44,auVar45);
  auVar45._4_4_ = iVar34;
  auVar45._0_4_ = iVar34;
  auVar45._8_4_ = iVar34;
  auVar45._12_4_ = iVar34;
  auVar45._16_4_ = iVar34;
  auVar45._20_4_ = iVar34;
  auVar45._24_4_ = iVar34;
  auVar45._28_4_ = iVar34;
  auVar45 = vpmulld_avx2((undefined1  [32])in[2],auVar45);
  auVar59 = vpsrad_avx2(auVar23,ZEXT416((uint)bit));
  auVar64 = vpsrad_avx2(auVar80,ZEXT416((uint)bit));
  auVar56 = ZEXT416((uint)bit);
  auVar65 = vpsrad_avx2(auVar77,auVar56);
  auVar67 = vpsrad_avx2(auVar67,auVar56);
  auVar49 = vpsrad_avx2(auVar49,auVar56);
  auVar50 = vpsrad_avx2(auVar50,auVar56);
  auVar56 = ZEXT416((uint)bit);
  auVar58 = vpsrad_avx2(auVar58,auVar56);
  auVar80 = vpmulld_avx2((undefined1  [32])in[0x1e],auVar87);
  auVar85 = vpsrad_avx2(auVar85,auVar56);
  auVar23 = vpaddd_avx2(auVar45,auVar60);
  auVar23 = vpaddd_avx2(auVar80,auVar23);
  auVar78 = vpsrad_avx2(auVar78,auVar56);
  auVar80 = vpaddd_avx2(auVar64,auVar59);
  auVar45 = vpsubd_avx2(auVar59,auVar64);
  auVar36 = vpsrad_avx2(auVar36,auVar56);
  auVar77 = vpaddd_avx2(auVar67,auVar65);
  auVar59 = vpsubd_avx2(auVar67,auVar65);
  auVar37 = vpsrad_avx2(auVar37,auVar56);
  auVar67 = vpaddd_avx2(auVar50,auVar49);
  auVar64 = vpsubd_avx2(auVar49,auVar50);
  auVar38 = vpsrad_avx2(auVar38,auVar56);
  auVar49 = vpaddd_avx2(auVar85,auVar58);
  auVar65 = vpsubd_avx2(auVar85,auVar58);
  auVar39 = vpsrad_avx2(auVar39,auVar56);
  auVar50 = vpaddd_avx2(auVar36,auVar78);
  auVar68 = vpsubd_avx2(auVar78,auVar36);
  auVar78 = vpsrad_avx2(auVar40,auVar56);
  auVar58 = vpaddd_avx2(auVar38,auVar37);
  auVar69 = vpsubd_avx2(auVar38,auVar37);
  auVar56 = ZEXT416((uint)bit);
  auVar36 = vpsrad_avx2(auVar41,auVar56);
  auVar85 = vpaddd_avx2(auVar78,auVar39);
  auVar70 = vpsubd_avx2(auVar39,auVar78);
  auVar37 = vpsrad_avx2(auVar42,auVar56);
  auVar78 = vpaddd_avx2(auVar37,auVar36);
  auVar71 = vpsubd_avx2(auVar37,auVar36);
  iVar34 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x240);
  iVar27 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x180);
  iVar28 = -iVar27;
  auVar72._4_4_ = iVar34;
  auVar72._0_4_ = iVar34;
  auVar72._8_4_ = iVar34;
  auVar72._12_4_ = iVar34;
  auVar72._16_4_ = iVar34;
  auVar72._20_4_ = iVar34;
  auVar72._24_4_ = iVar34;
  auVar72._28_4_ = iVar34;
  auVar75._4_4_ = iVar28;
  auVar75._0_4_ = iVar28;
  auVar75._8_4_ = iVar28;
  auVar75._12_4_ = iVar28;
  auVar75._16_4_ = iVar28;
  auVar75._20_4_ = iVar28;
  auVar75._24_4_ = iVar28;
  auVar75._28_4_ = iVar28;
  auVar36 = vpmulld_avx2((undefined1  [32])in[4],auVar72);
  auVar36 = vpaddd_avx2(auVar36,auVar60);
  auVar37 = vpmulld_avx2((undefined1  [32])in[0x1c],auVar75);
  auVar36 = vpaddd_avx2(auVar36,auVar37);
  iVar28 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x1c0);
  iVar31 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x200);
  iVar24 = -iVar31;
  auVar62._4_4_ = iVar28;
  auVar62._0_4_ = iVar28;
  auVar62._8_4_ = iVar28;
  auVar62._12_4_ = iVar28;
  auVar62._16_4_ = iVar28;
  auVar62._20_4_ = iVar28;
  auVar62._24_4_ = iVar28;
  auVar62._28_4_ = iVar28;
  auVar41 = vpsrad_avx2(auVar51,auVar56);
  auVar82._4_4_ = iVar24;
  auVar82._0_4_ = iVar24;
  auVar82._8_4_ = iVar24;
  auVar82._12_4_ = iVar24;
  auVar82._16_4_ = iVar24;
  auVar82._20_4_ = iVar24;
  auVar82._24_4_ = iVar24;
  auVar82._28_4_ = iVar24;
  auVar42 = vpsrad_avx2(auVar52,auVar56);
  auVar37 = vpmulld_avx2((undefined1  [32])in[0x14],auVar62);
  auVar37 = vpaddd_avx2(auVar37,auVar60);
  auVar38 = vpmulld_avx2((undefined1  [32])in[0xc],auVar82);
  auVar37 = vpaddd_avx2(auVar37,auVar38);
  auVar51 = vpsrad_avx2(auVar53,auVar56);
  auVar90._4_4_ = iVar31;
  auVar90._0_4_ = iVar31;
  auVar90._8_4_ = iVar31;
  auVar90._12_4_ = iVar31;
  auVar90._16_4_ = iVar31;
  auVar90._20_4_ = iVar31;
  auVar90._24_4_ = iVar31;
  auVar90._28_4_ = iVar31;
  auVar38 = vpmulld_avx2((undefined1  [32])in[0x14],auVar90);
  auVar39 = vpmulld_avx2((undefined1  [32])in[0xc],auVar62);
  auVar38 = vpaddd_avx2(auVar38,auVar60);
  auVar38 = vpaddd_avx2(auVar38,auVar39);
  auVar52 = vpsrad_avx2(auVar57,auVar56);
  auVar46._4_4_ = iVar27;
  auVar46._0_4_ = iVar27;
  auVar46._8_4_ = iVar27;
  auVar46._12_4_ = iVar27;
  auVar46._16_4_ = iVar27;
  auVar46._20_4_ = iVar27;
  auVar46._24_4_ = iVar27;
  auVar46._28_4_ = iVar27;
  auVar39 = vpmulld_avx2((undefined1  [32])in[4],auVar46);
  auVar40 = vpmulld_avx2((undefined1  [32])in[0x1c],auVar72);
  auVar39 = vpaddd_avx2(auVar39,auVar60);
  auVar39 = vpaddd_avx2(auVar39,auVar40);
  auVar53 = vpsrad_avx2(auVar61,auVar56);
  auVar40 = vpaddd_avx2(auVar42,auVar41);
  auVar61 = vpsubd_avx2(auVar41,auVar42);
  auVar57 = vpsrad_avx2(auVar43,auVar56);
  auVar41 = vpaddd_avx2(auVar51,auVar52);
  auVar43 = vpsubd_avx2(auVar52,auVar51);
  auVar51 = vpsrad_avx2(auVar44,auVar56);
  auVar42 = vpaddd_avx2(auVar57,auVar53);
  auVar53 = vpsubd_avx2(auVar53,auVar57);
  auVar52 = vpsrad_avx2(auVar23,auVar56);
  auVar23 = vpaddd_avx2(auVar52,auVar51);
  auVar51 = vpsubd_avx2(auVar52,auVar51);
  iVar34 = -iVar34;
  iVar28 = -iVar28;
  iVar27 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x1e0);
  iVar35 = -iVar27;
  iVar31 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x220);
  iVar33 = -iVar31;
  iVar24 = *(int *)((long)vert_filter_length_chroma + lVar30 + 0x1a0);
  iVar32 = -iVar24;
  iVar26 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar25 = 0x8000;
  if (0xf < iVar26) {
    iVar25 = 1 << ((char)iVar26 - 1U & 0x1f);
  }
  iVar26 = -iVar25;
  iVar25 = iVar25 + -1;
  auVar55._4_4_ = iVar26;
  auVar55._0_4_ = iVar26;
  auVar55._8_4_ = iVar26;
  auVar55._12_4_ = iVar26;
  auVar55._16_4_ = iVar26;
  auVar55._20_4_ = iVar26;
  auVar55._24_4_ = iVar26;
  auVar55._28_4_ = iVar26;
  auVar54._4_4_ = iVar25;
  auVar54._0_4_ = iVar25;
  auVar54._8_4_ = iVar25;
  auVar54._12_4_ = iVar25;
  auVar54._16_4_ = iVar25;
  auVar54._20_4_ = iVar25;
  auVar54._24_4_ = iVar25;
  auVar54._28_4_ = iVar25;
  auVar52 = vpmaxsd_avx2(auVar55,auVar45);
  auVar73 = vpminsd_avx2(auVar52,auVar54);
  auVar52 = vpmaxsd_avx2(auVar71,auVar55);
  auVar71 = vpminsd_avx2(auVar52,auVar54);
  auVar52 = vpmulld_avx2(auVar73,auVar75);
  auVar52 = vpaddd_avx2(auVar52,auVar60);
  auVar57 = vpmulld_avx2(auVar71,auVar72);
  auVar52 = vpaddd_avx2(auVar57,auVar52);
  auVar66._4_4_ = iVar34;
  auVar66._0_4_ = iVar34;
  auVar66._8_4_ = iVar34;
  auVar66._12_4_ = iVar34;
  auVar66._16_4_ = iVar34;
  auVar66._20_4_ = iVar34;
  auVar66._24_4_ = iVar34;
  auVar66._28_4_ = iVar34;
  auVar57 = vpmaxsd_avx2(auVar55,auVar59);
  auVar74 = vpminsd_avx2(auVar57,auVar54);
  auVar57 = vpmaxsd_avx2(auVar55,auVar70);
  auVar70 = vpminsd_avx2(auVar57,auVar54);
  auVar57 = vpmulld_avx2(auVar74,auVar66);
  auVar57 = vpaddd_avx2(auVar57,auVar60);
  auVar44 = vpmulld_avx2(auVar70,auVar75);
  auVar57 = vpaddd_avx2(auVar57,auVar44);
  auVar44 = vpmaxsd_avx2(auVar55,auVar64);
  auVar64 = vpminsd_avx2(auVar44,auVar54);
  auVar44 = vpmaxsd_avx2(auVar55,auVar69);
  auVar69 = vpminsd_avx2(auVar44,auVar54);
  auVar44 = vpmulld_avx2(auVar64,auVar82);
  auVar44 = vpaddd_avx2(auVar44,auVar60);
  auVar45 = vpmulld_avx2(auVar69,auVar62);
  auVar44 = vpaddd_avx2(auVar45,auVar44);
  auVar47._4_4_ = iVar28;
  auVar47._0_4_ = iVar28;
  auVar47._8_4_ = iVar28;
  auVar47._12_4_ = iVar28;
  auVar47._16_4_ = iVar28;
  auVar47._20_4_ = iVar28;
  auVar47._24_4_ = iVar28;
  auVar47._28_4_ = iVar28;
  auVar45 = vpmaxsd_avx2(auVar55,auVar65);
  auVar59 = vpminsd_avx2(auVar45,auVar54);
  auVar45 = vpmaxsd_avx2(auVar55,auVar68);
  auVar65 = vpminsd_avx2(auVar45,auVar54);
  auVar45 = vpmulld_avx2(auVar59,auVar47);
  auVar45 = vpaddd_avx2(auVar45,auVar60);
  auVar68 = vpmulld_avx2(auVar65,auVar82);
  auVar45 = vpaddd_avx2(auVar68,auVar45);
  auVar59 = vpmulld_avx2(auVar59,auVar82);
  auVar65 = vpmulld_avx2(auVar65,auVar62);
  auVar59 = vpaddd_avx2(auVar59,auVar60);
  auVar59 = vpaddd_avx2(auVar65,auVar59);
  auVar64 = vpmulld_avx2(auVar64,auVar62);
  auVar65 = vpmulld_avx2(auVar69,auVar90);
  auVar64 = vpaddd_avx2(auVar64,auVar60);
  auVar64 = vpaddd_avx2(auVar64,auVar65);
  auVar65 = vpmulld_avx2(auVar74,auVar75);
  auVar68 = vpmulld_avx2(auVar70,auVar72);
  auVar65 = vpaddd_avx2(auVar65,auVar60);
  auVar65 = vpaddd_avx2(auVar65,auVar68);
  auVar68 = vpmulld_avx2(auVar73,auVar72);
  auVar69 = vpmulld_avx2(auVar71,auVar46);
  auVar68 = vpaddd_avx2(auVar68,auVar60);
  auVar68 = vpaddd_avx2(auVar68,auVar69);
  auVar63._4_4_ = iVar27;
  auVar63._0_4_ = iVar27;
  auVar63._8_4_ = iVar27;
  auVar63._12_4_ = iVar27;
  auVar63._16_4_ = iVar27;
  auVar63._20_4_ = iVar27;
  auVar63._24_4_ = iVar27;
  auVar63._28_4_ = iVar27;
  auVar88._4_4_ = iVar35;
  auVar88._0_4_ = iVar35;
  auVar88._8_4_ = iVar35;
  auVar88._12_4_ = iVar35;
  auVar88._16_4_ = iVar35;
  auVar88._20_4_ = iVar35;
  auVar88._24_4_ = iVar35;
  auVar88._28_4_ = iVar35;
  auVar70 = vpmulld_avx2((undefined1  [32])*in,auVar63);
  auVar69 = vpaddd_avx2((undefined1  [32])in[0x10],(undefined1  [32])*in);
  auVar71 = vpmulld_avx2((undefined1  [32])in[0x10],auVar88);
  auVar70 = vpaddd_avx2(auVar70,auVar60);
  auVar70 = vpaddd_avx2(auVar70,auVar71);
  auVar76._4_4_ = iVar31;
  auVar76._0_4_ = iVar31;
  auVar76._8_4_ = iVar31;
  auVar76._12_4_ = iVar31;
  auVar76._16_4_ = iVar31;
  auVar76._20_4_ = iVar31;
  auVar76._24_4_ = iVar31;
  auVar76._28_4_ = iVar31;
  auVar83._4_4_ = iVar32;
  auVar83._0_4_ = iVar32;
  auVar83._8_4_ = iVar32;
  auVar83._12_4_ = iVar32;
  auVar83._16_4_ = iVar32;
  auVar83._20_4_ = iVar32;
  auVar83._24_4_ = iVar32;
  auVar83._28_4_ = iVar32;
  auVar71 = vpmulld_avx2((undefined1  [32])in[8],auVar76);
  auVar71 = vpaddd_avx2(auVar71,auVar60);
  auVar46 = vpmulld_avx2((undefined1  [32])in[0x18],auVar83);
  auVar71 = vpaddd_avx2(auVar46,auVar71);
  auVar48._4_4_ = iVar24;
  auVar48._0_4_ = iVar24;
  auVar48._8_4_ = iVar24;
  auVar48._12_4_ = iVar24;
  auVar48._16_4_ = iVar24;
  auVar48._20_4_ = iVar24;
  auVar48._24_4_ = iVar24;
  auVar48._28_4_ = iVar24;
  auVar46 = vpmulld_avx2((undefined1  [32])in[8],auVar48);
  auVar62 = vpmulld_avx2((undefined1  [32])in[0x18],auVar76);
  auVar46 = vpaddd_avx2(auVar46,auVar60);
  auVar46 = vpaddd_avx2(auVar46,auVar62);
  auVar62 = vpsrad_avx2(auVar36,auVar56);
  auVar37 = vpsrad_avx2(auVar37,auVar56);
  auVar36 = vpaddd_avx2(auVar37,auVar62);
  auVar72 = vpsubd_avx2(auVar62,auVar37);
  auVar38 = vpsrad_avx2(auVar38,auVar56);
  auVar39 = vpsrad_avx2(auVar39,auVar56);
  auVar37 = vpaddd_avx2(auVar39,auVar38);
  auVar73 = vpsubd_avx2(auVar39,auVar38);
  auVar38 = vpmaxsd_avx2(auVar55,auVar61);
  auVar61 = vpminsd_avx2(auVar38,auVar54);
  auVar38 = vpmaxsd_avx2(auVar55,auVar51);
  auVar62 = vpminsd_avx2(auVar38,auVar54);
  auVar38 = vpmulld_avx2(auVar61,auVar83);
  auVar38 = vpaddd_avx2(auVar38,auVar60);
  auVar39 = vpmulld_avx2(auVar62,auVar76);
  auVar38 = vpaddd_avx2(auVar39,auVar38);
  auVar79._4_4_ = iVar33;
  auVar79._0_4_ = iVar33;
  auVar79._8_4_ = iVar33;
  auVar79._12_4_ = iVar33;
  auVar79._16_4_ = iVar33;
  auVar79._20_4_ = iVar33;
  auVar79._24_4_ = iVar33;
  auVar79._28_4_ = iVar33;
  auVar39 = vpmaxsd_avx2(auVar55,auVar43);
  auVar51 = vpminsd_avx2(auVar39,auVar54);
  auVar39 = vpmaxsd_avx2(auVar55,auVar53);
  auVar53 = vpminsd_avx2(auVar39,auVar54);
  auVar39 = vpmulld_avx2(auVar51,auVar79);
  auVar39 = vpaddd_avx2(auVar39,auVar60);
  auVar43 = vpmulld_avx2(auVar53,auVar83);
  auVar39 = vpaddd_avx2(auVar39,auVar43);
  auVar51 = vpmulld_avx2(auVar51,auVar83);
  auVar53 = vpmulld_avx2(auVar53,auVar76);
  auVar51 = vpaddd_avx2(auVar51,auVar60);
  auVar51 = vpaddd_avx2(auVar51,auVar53);
  auVar53 = vpmulld_avx2(auVar61,auVar76);
  auVar61 = vpmulld_avx2(auVar62,auVar48);
  auVar53 = vpaddd_avx2(auVar53,auVar60);
  auVar53 = vpaddd_avx2(auVar53,auVar61);
  auVar80 = vpmaxsd_avx2(auVar55,auVar80);
  auVar61 = vpminsd_avx2(auVar80,auVar54);
  auVar80 = vpmaxsd_avx2(auVar55,auVar77);
  auVar77 = vpminsd_avx2(auVar80,auVar54);
  auVar80 = vpaddd_avx2(auVar77,auVar61);
  auVar62 = vpsubd_avx2(auVar61,auVar77);
  auVar52 = vpsrad_avx2(auVar52,auVar56);
  auVar57 = vpsrad_avx2(auVar57,auVar56);
  auVar77 = vpaddd_avx2(auVar57,auVar52);
  auVar74 = vpsubd_avx2(auVar52,auVar57);
  auVar67 = vpmaxsd_avx2(auVar55,auVar67);
  auVar52 = vpminsd_avx2(auVar67,auVar54);
  auVar67 = vpmaxsd_avx2(auVar55,auVar49);
  auVar49 = vpminsd_avx2(auVar67,auVar54);
  auVar67 = vpaddd_avx2(auVar49,auVar52);
  auVar75 = vpsubd_avx2(auVar49,auVar52);
  auVar56 = ZEXT416((uint)bit);
  auVar52 = vpsrad_avx2(auVar44,auVar56);
  auVar57 = vpsrad_avx2(auVar45,auVar56);
  auVar49 = vpaddd_avx2(auVar57,auVar52);
  auVar81 = vpsubd_avx2(auVar57,auVar52);
  auVar50 = vpmaxsd_avx2(auVar55,auVar50);
  auVar52 = vpminsd_avx2(auVar50,auVar54);
  auVar50 = vpmaxsd_avx2(auVar55,auVar58);
  auVar58 = vpminsd_avx2(auVar50,auVar54);
  auVar50 = vpaddd_avx2(auVar58,auVar52);
  auVar82 = vpsubd_avx2(auVar52,auVar58);
  auVar52 = vpsrad_avx2(auVar59,auVar56);
  auVar57 = vpsrad_avx2(auVar64,auVar56);
  auVar58 = vpaddd_avx2(auVar57,auVar52);
  auVar84 = vpsubd_avx2(auVar52,auVar57);
  auVar85 = vpmaxsd_avx2(auVar55,auVar85);
  auVar52 = vpminsd_avx2(auVar85,auVar54);
  auVar85 = vpmaxsd_avx2(auVar55,auVar78);
  auVar78 = vpminsd_avx2(auVar85,auVar54);
  auVar85 = vpaddd_avx2(auVar78,auVar52);
  auVar86 = vpsubd_avx2(auVar78,auVar52);
  auVar52 = vpsrad_avx2(auVar65,auVar56);
  auVar57 = vpsrad_avx2(auVar68,auVar56);
  auVar78 = vpaddd_avx2(auVar57,auVar52);
  auVar59 = vpsubd_avx2(auVar57,auVar52);
  auVar52 = vpmulld_avx2(auVar63,auVar69);
  auVar52 = vpaddd_avx2(auVar52,auVar60);
  auVar57 = vpsrad_avx2(auVar52,auVar56);
  auVar61 = vpsrad_avx2(auVar46,auVar56);
  auVar52 = vpaddd_avx2(auVar61,auVar57);
  auVar46 = vpsubd_avx2(auVar57,auVar61);
  auVar61 = vpsrad_avx2(auVar70,auVar56);
  auVar43 = vpsrad_avx2(auVar71,auVar56);
  auVar57 = vpaddd_avx2(auVar43,auVar61);
  auVar87 = vpsubd_avx2(auVar61,auVar43);
  auVar61 = vpmaxsd_avx2(auVar55,auVar72);
  auVar43 = vpminsd_avx2(auVar61,auVar54);
  auVar61 = vpmaxsd_avx2(auVar55,auVar73);
  auVar44 = vpminsd_avx2(auVar61,auVar54);
  auVar61 = vpmulld_avx2(auVar43,auVar88);
  auVar61 = vpaddd_avx2(auVar61,auVar60);
  auVar45 = vpmulld_avx2(auVar44,auVar63);
  auVar61 = vpaddd_avx2(auVar61,auVar45);
  auVar43 = vpaddd_avx2(auVar44,auVar43);
  auVar40 = vpmaxsd_avx2(auVar55,auVar40);
  auVar44 = vpminsd_avx2(auVar40,auVar54);
  auVar40 = vpmaxsd_avx2(auVar55,auVar41);
  auVar41 = vpsrad_avx2(auVar38,auVar56);
  auVar40 = vpminsd_avx2(auVar40,auVar54);
  auVar45 = vpsrad_avx2(auVar39,auVar56);
  auVar38 = vpaddd_avx2(auVar40,auVar44);
  auVar72 = vpsubd_avx2(auVar44,auVar40);
  auVar39 = vpaddd_avx2(auVar41,auVar45);
  auVar73 = vpsubd_avx2(auVar41,auVar45);
  auVar40 = vpmaxsd_avx2(auVar55,auVar42);
  auVar40 = vpminsd_avx2(auVar40,auVar54);
  auVar23 = vpmaxsd_avx2(auVar55,auVar23);
  auVar42 = vpsrad_avx2(auVar51,auVar56);
  auVar41 = vpminsd_avx2(auVar23,auVar54);
  auVar51 = vpsrad_avx2(auVar53,auVar56);
  auVar23 = vpaddd_avx2(auVar41,auVar40);
  auVar90 = vpsubd_avx2(auVar41,auVar40);
  auVar40 = vpaddd_avx2(auVar51,auVar42);
  auVar47 = vpsubd_avx2(auVar51,auVar42);
  auVar41 = vpmaxsd_avx2(auVar55,auVar74);
  auVar64 = vpminsd_avx2(auVar41,auVar54);
  auVar41 = vpmaxsd_avx2(auVar59,auVar55);
  auVar65 = vpminsd_avx2(auVar41,auVar54);
  auVar41 = vpmulld_avx2(auVar64,auVar83);
  auVar41 = vpaddd_avx2(auVar41,auVar60);
  auVar42 = vpmulld_avx2(auVar65,auVar76);
  auVar41 = vpaddd_avx2(auVar41,auVar42);
  auVar42 = vpmaxsd_avx2(auVar55,auVar62);
  auVar59 = vpminsd_avx2(auVar42,auVar54);
  auVar42 = vpmaxsd_avx2(auVar86,auVar55);
  auVar68 = vpminsd_avx2(auVar42,auVar54);
  auVar42 = vpmulld_avx2(auVar59,auVar83);
  auVar42 = vpaddd_avx2(auVar42,auVar60);
  auVar51 = vpmulld_avx2(auVar68,auVar76);
  auVar42 = vpaddd_avx2(auVar51,auVar42);
  auVar51 = vpmaxsd_avx2(auVar55,auVar75);
  auVar45 = vpminsd_avx2(auVar51,auVar54);
  auVar51 = vpmaxsd_avx2(auVar55,auVar82);
  auVar69 = vpminsd_avx2(auVar51,auVar54);
  auVar51 = vpmulld_avx2(auVar45,auVar79);
  auVar51 = vpaddd_avx2(auVar51,auVar60);
  auVar53 = vpmulld_avx2(auVar69,auVar83);
  auVar51 = vpaddd_avx2(auVar51,auVar53);
  auVar53 = vpmaxsd_avx2(auVar55,auVar81);
  auVar44 = vpminsd_avx2(auVar53,auVar54);
  auVar53 = vpmaxsd_avx2(auVar55,auVar84);
  auVar70 = vpminsd_avx2(auVar53,auVar54);
  auVar53 = vpmulld_avx2(auVar44,auVar79);
  auVar53 = vpaddd_avx2(auVar53,auVar60);
  auVar71 = vpmulld_avx2(auVar70,auVar83);
  auVar53 = vpaddd_avx2(auVar53,auVar71);
  auVar44 = vpmulld_avx2(auVar44,auVar83);
  auVar70 = vpmulld_avx2(auVar70,auVar76);
  auVar44 = vpaddd_avx2(auVar44,auVar60);
  auVar44 = vpaddd_avx2(auVar44,auVar70);
  auVar45 = vpmulld_avx2(auVar45,auVar83);
  auVar69 = vpmulld_avx2(auVar69,auVar76);
  auVar45 = vpaddd_avx2(auVar45,auVar60);
  auVar45 = vpaddd_avx2(auVar45,auVar69);
  auVar59 = vpmulld_avx2(auVar59,auVar76);
  auVar68 = vpmulld_avx2(auVar68,auVar48);
  auVar59 = vpaddd_avx2(auVar59,auVar60);
  auVar59 = vpaddd_avx2(auVar59,auVar68);
  auVar64 = vpmulld_avx2(auVar64,auVar76);
  auVar65 = vpmulld_avx2(auVar65,auVar48);
  auVar64 = vpaddd_avx2(auVar64,auVar60);
  auVar64 = vpaddd_avx2(auVar64,auVar65);
  auVar37 = vpmaxsd_avx2(auVar55,auVar37);
  auVar65 = vpminsd_avx2(auVar37,auVar54);
  auVar37 = vpmaxsd_avx2(auVar55,auVar52);
  auVar52 = vpminsd_avx2(auVar37,auVar54);
  auVar37 = vpaddd_avx2(auVar52,auVar65);
  auVar62 = vpsubd_avx2(auVar52,auVar65);
  auVar52 = vpmaxsd_avx2(auVar55,auVar57);
  auVar57 = vpminsd_avx2(auVar52,auVar54);
  auVar52 = vpmulld_avx2(auVar63,auVar43);
  auVar52 = vpaddd_avx2(auVar52,auVar60);
  auVar43 = vpsrad_avx2(auVar52,auVar56);
  auVar52 = vpaddd_avx2(auVar43,auVar57);
  auVar74 = vpsubd_avx2(auVar57,auVar43);
  auVar57 = vpmaxsd_avx2(auVar55,auVar87);
  auVar43 = vpsrad_avx2(auVar61,auVar56);
  auVar61 = vpminsd_avx2(auVar57,auVar54);
  auVar57 = vpaddd_avx2(auVar43,auVar61);
  auVar75 = vpsubd_avx2(auVar61,auVar43);
  auVar36 = vpmaxsd_avx2(auVar55,auVar36);
  auVar61 = vpminsd_avx2(auVar36,auVar54);
  auVar36 = vpmaxsd_avx2(auVar55,auVar46);
  auVar43 = vpminsd_avx2(auVar36,auVar54);
  auVar36 = vpaddd_avx2(auVar43,auVar61);
  auVar46 = vpsubd_avx2(auVar43,auVar61);
  auVar61 = vpmaxsd_avx2(auVar55,auVar73);
  auVar68 = vpminsd_avx2(auVar61,auVar54);
  auVar61 = vpmaxsd_avx2(auVar55,auVar47);
  auVar69 = vpminsd_avx2(auVar61,auVar54);
  auVar61 = vpmulld_avx2(auVar68,auVar88);
  auVar61 = vpaddd_avx2(auVar61,auVar60);
  auVar43 = vpmulld_avx2(auVar69,auVar63);
  auVar61 = vpaddd_avx2(auVar61,auVar43);
  auVar43 = vpmaxsd_avx2(auVar55,auVar72);
  auVar65 = vpminsd_avx2(auVar43,auVar54);
  auVar43 = vpmaxsd_avx2(auVar55,auVar90);
  auVar70 = vpminsd_avx2(auVar43,auVar54);
  auVar43 = vpmulld_avx2(auVar65,auVar88);
  auVar43 = vpaddd_avx2(auVar43,auVar60);
  auVar71 = vpmulld_avx2(auVar70,auVar63);
  auVar43 = vpaddd_avx2(auVar71,auVar43);
  auVar65 = vpaddd_avx2(auVar70,auVar65);
  auVar68 = vpaddd_avx2(auVar69,auVar68);
  auVar80 = vpmaxsd_avx2(auVar55,auVar80);
  auVar69 = vpminsd_avx2(auVar80,auVar54);
  auVar80 = vpmaxsd_avx2(auVar55,auVar67);
  auVar67 = vpminsd_avx2(auVar80,auVar54);
  auVar80 = vpaddd_avx2(auVar67,auVar69);
  auVar69 = vpsubd_avx2(auVar69,auVar67);
  auVar77 = vpmaxsd_avx2(auVar55,auVar77);
  auVar67 = vpminsd_avx2(auVar77,auVar54);
  auVar77 = vpmaxsd_avx2(auVar55,auVar49);
  auVar41 = vpsrad_avx2(auVar41,auVar56);
  auVar42 = vpsrad_avx2(auVar42,auVar56);
  auVar49 = vpminsd_avx2(auVar77,auVar54);
  auVar51 = vpsrad_avx2(auVar51,auVar56);
  auVar77 = vpaddd_avx2(auVar49,auVar67);
  auVar70 = vpsubd_avx2(auVar67,auVar49);
  auVar49 = vpsrad_avx2(auVar53,auVar56);
  auVar67 = vpaddd_avx2(auVar41,auVar49);
  auVar53 = vpsubd_avx2(auVar41,auVar49);
  auVar49 = vpaddd_avx2(auVar51,auVar42);
  auVar71 = vpsubd_avx2(auVar42,auVar51);
  auVar50 = vpmaxsd_avx2(auVar55,auVar50);
  auVar41 = vpminsd_avx2(auVar50,auVar54);
  auVar50 = vpmaxsd_avx2(auVar55,auVar85);
  auVar85 = vpminsd_avx2(auVar50,auVar54);
  auVar50 = vpaddd_avx2(auVar85,auVar41);
  auVar72 = vpsubd_avx2(auVar85,auVar41);
  auVar58 = vpmaxsd_avx2(auVar55,auVar58);
  auVar85 = vpminsd_avx2(auVar58,auVar54);
  auVar58 = vpmaxsd_avx2(auVar55,auVar78);
  auVar41 = vpsrad_avx2(auVar44,auVar56);
  auVar42 = vpsrad_avx2(auVar45,auVar56);
  auVar78 = vpminsd_avx2(auVar58,auVar54);
  auVar51 = vpsrad_avx2(auVar59,auVar56);
  auVar58 = vpaddd_avx2(auVar78,auVar85);
  auVar73 = vpsubd_avx2(auVar78,auVar85);
  auVar78 = vpsrad_avx2(auVar64,auVar56);
  auVar85 = vpaddd_avx2(auVar41,auVar78);
  auVar64 = vpsubd_avx2(auVar78,auVar41);
  auVar78 = vpaddd_avx2(auVar51,auVar42);
  auVar44 = vpsubd_avx2(auVar51,auVar42);
  auVar23 = vpmaxsd_avx2(auVar55,auVar23);
  auVar41 = vpminsd_avx2(auVar23,auVar54);
  auVar23 = vpmaxsd_avx2(auVar55,auVar37);
  auVar37 = vpminsd_avx2(auVar23,auVar54);
  auVar23 = vpaddd_avx2(auVar37,auVar41);
  auVar81 = vpsubd_avx2(auVar37,auVar41);
  auVar37 = vpmaxsd_avx2(auVar55,auVar40);
  auVar40 = vpminsd_avx2(auVar37,auVar54);
  auVar37 = vpmaxsd_avx2(auVar55,auVar52);
  auVar41 = vpminsd_avx2(auVar37,auVar54);
  auVar37 = vpaddd_avx2(auVar41,auVar40);
  auVar82 = vpsubd_avx2(auVar41,auVar40);
  auVar41 = vpmaxsd_avx2(auVar55,auVar57);
  auVar40 = vpmulld_avx2(auVar68,auVar63);
  auVar40 = vpaddd_avx2(auVar40,auVar60);
  auVar42 = vpsrad_avx2(auVar40,auVar56);
  auVar41 = vpminsd_avx2(auVar41,auVar54);
  auVar40 = vpaddd_avx2(auVar42,auVar41);
  auVar84 = vpsubd_avx2(auVar41,auVar42);
  auVar41 = vpmaxsd_avx2(auVar55,auVar36);
  auVar36 = vpmulld_avx2(auVar65,auVar63);
  auVar36 = vpaddd_avx2(auVar36,auVar60);
  auVar42 = vpsrad_avx2(auVar36,auVar56);
  auVar41 = vpminsd_avx2(auVar41,auVar54);
  auVar36 = vpaddd_avx2(auVar41,auVar42);
  auVar86 = vpsubd_avx2(auVar41,auVar42);
  auVar41 = vpmaxsd_avx2(auVar55,auVar46);
  auVar42 = vpminsd_avx2(auVar41,auVar54);
  auVar51 = vpsrad_avx2(auVar43,auVar56);
  auVar41 = vpaddd_avx2(auVar51,auVar42);
  auVar46 = vpsubd_avx2(auVar42,auVar51);
  auVar42 = vpmaxsd_avx2(auVar55,auVar75);
  auVar52 = vpsrad_avx2(auVar61,auVar56);
  auVar51 = vpminsd_avx2(auVar42,auVar54);
  auVar42 = vpaddd_avx2(auVar52,auVar51);
  auVar75 = vpsubd_avx2(auVar51,auVar52);
  auVar39 = vpmaxsd_avx2(auVar55,auVar39);
  auVar51 = vpminsd_avx2(auVar39,auVar54);
  auVar39 = vpmaxsd_avx2(auVar55,auVar74);
  auVar52 = vpminsd_avx2(auVar39,auVar54);
  auVar39 = vpaddd_avx2(auVar52,auVar51);
  auVar74 = vpsubd_avx2(auVar52,auVar51);
  auVar38 = vpmaxsd_avx2(auVar55,auVar38);
  auVar51 = vpminsd_avx2(auVar38,auVar54);
  auVar38 = vpmaxsd_avx2(auVar55,auVar62);
  auVar52 = vpminsd_avx2(auVar38,auVar54);
  auVar38 = vpaddd_avx2(auVar52,auVar51);
  auVar62 = vpsubd_avx2(auVar52,auVar51);
  auVar51 = vpmaxsd_avx2(auVar71,auVar55);
  auVar45 = vpminsd_avx2(auVar51,auVar54);
  auVar51 = vpmaxsd_avx2(auVar44,auVar55);
  auVar59 = vpminsd_avx2(auVar51,auVar54);
  auVar51 = vpmulld_avx2(auVar45,auVar88);
  auVar51 = vpaddd_avx2(auVar51,auVar60);
  auVar52 = vpmulld_avx2(auVar59,auVar63);
  auVar51 = vpaddd_avx2(auVar52,auVar51);
  auVar52 = vpmaxsd_avx2(auVar55,auVar53);
  auVar44 = vpminsd_avx2(auVar52,auVar54);
  auVar52 = vpmaxsd_avx2(auVar64,auVar55);
  auVar64 = vpminsd_avx2(auVar52,auVar54);
  auVar52 = vpmulld_avx2(auVar44,auVar88);
  auVar52 = vpaddd_avx2(auVar52,auVar60);
  auVar53 = vpmulld_avx2(auVar64,auVar63);
  auVar52 = vpaddd_avx2(auVar53,auVar52);
  auVar53 = vpmaxsd_avx2(auVar55,auVar70);
  auVar43 = vpminsd_avx2(auVar53,auVar54);
  auVar53 = vpmaxsd_avx2(auVar73,auVar55);
  auVar65 = vpminsd_avx2(auVar53,auVar54);
  auVar53 = vpmulld_avx2(auVar43,auVar88);
  auVar53 = vpaddd_avx2(auVar53,auVar60);
  auVar57 = vpmulld_avx2(auVar65,auVar63);
  auVar53 = vpaddd_avx2(auVar53,auVar57);
  auVar57 = vpmaxsd_avx2(auVar55,auVar69);
  auVar61 = vpminsd_avx2(auVar57,auVar54);
  auVar57 = vpmaxsd_avx2(auVar55,auVar72);
  auVar68 = vpminsd_avx2(auVar57,auVar54);
  auVar57 = vpmulld_avx2(auVar61,auVar88);
  auVar57 = vpaddd_avx2(auVar57,auVar60);
  auVar69 = vpmulld_avx2(auVar68,auVar63);
  auVar57 = vpaddd_avx2(auVar57,auVar69);
  auVar61 = vpaddd_avx2(auVar68,auVar61);
  auVar43 = vpaddd_avx2(auVar65,auVar43);
  auVar44 = vpaddd_avx2(auVar44,auVar64);
  auVar64 = vpsrad_avx2(auVar51,auVar56);
  auVar65 = vpsrad_avx2(auVar52,auVar56);
  auVar68 = vpsrad_avx2(auVar53,auVar56);
  auVar51 = vpaddd_avx2(auVar59,auVar45);
  auVar57 = vpsrad_avx2(auVar57,auVar56);
  auVar52 = vpmulld_avx2(auVar61,auVar63);
  auVar52 = vpaddd_avx2(auVar52,auVar60);
  auVar56 = ZEXT416((uint)bit);
  auVar61 = vpsrad_avx2(auVar52,auVar56);
  auVar52 = vpmulld_avx2(auVar43,auVar63);
  auVar52 = vpaddd_avx2(auVar52,auVar60);
  auVar43 = vpsrad_avx2(auVar52,auVar56);
  auVar52 = vpmulld_avx2(auVar44,auVar63);
  auVar53 = vpmulld_avx2(auVar51,auVar63);
  auVar51 = vpaddd_avx2(auVar52,auVar60);
  auVar52 = vpsrad_avx2(auVar51,auVar56);
  auVar51 = vpaddd_avx2(auVar53,auVar60);
  auVar53 = vpsrad_avx2(auVar51,auVar56);
  auVar50 = vpmaxsd_avx2(auVar55,auVar50);
  auVar50 = vpminsd_avx2(auVar50,auVar54);
  auVar23 = vpmaxsd_avx2(auVar55,auVar23);
  auVar51 = vpminsd_avx2(auVar23,auVar54);
  auVar23 = vpaddd_avx2(auVar51,auVar50);
  auVar50 = vpsubd_avx2(auVar51,auVar50);
  auVar23 = vpmaxsd_avx2(auVar23,auVar55);
  alVar2 = (__m256i)vpminsd_avx2(auVar23,auVar54);
  auVar23 = vpmaxsd_avx2(auVar50,auVar55);
  alVar3 = (__m256i)vpminsd_avx2(auVar23,auVar54);
  *out = alVar2;
  out[0x1f] = alVar3;
  auVar23 = vpmaxsd_avx2(auVar55,auVar58);
  auVar50 = vpminsd_avx2(auVar23,auVar54);
  auVar23 = vpmaxsd_avx2(auVar55,auVar37);
  auVar58 = vpminsd_avx2(auVar23,auVar54);
  auVar23 = vpaddd_avx2(auVar58,auVar50);
  auVar50 = vpsubd_avx2(auVar58,auVar50);
  auVar23 = vpmaxsd_avx2(auVar23,auVar55);
  alVar3 = (__m256i)vpminsd_avx2(auVar23,auVar54);
  auVar23 = vpmaxsd_avx2(auVar50,auVar55);
  alVar4 = (__m256i)vpminsd_avx2(auVar23,auVar54);
  out[1] = alVar3;
  out[0x1e] = alVar4;
  auVar23 = vpmaxsd_avx2(auVar55,auVar85);
  auVar50 = vpminsd_avx2(auVar23,auVar54);
  auVar23 = vpmaxsd_avx2(auVar55,auVar40);
  auVar58 = vpminsd_avx2(auVar23,auVar54);
  auVar23 = vpaddd_avx2(auVar58,auVar50);
  auVar50 = vpsubd_avx2(auVar58,auVar50);
  auVar23 = vpmaxsd_avx2(auVar23,auVar55);
  alVar4 = (__m256i)vpminsd_avx2(auVar23,auVar54);
  auVar23 = vpmaxsd_avx2(auVar50,auVar55);
  alVar5 = (__m256i)vpminsd_avx2(auVar23,auVar54);
  out[2] = alVar4;
  out[0x1d] = alVar5;
  auVar23 = vpmaxsd_avx2(auVar55,auVar78);
  auVar50 = vpminsd_avx2(auVar23,auVar54);
  auVar23 = vpmaxsd_avx2(auVar55,auVar36);
  auVar58 = vpminsd_avx2(auVar23,auVar54);
  auVar23 = vpaddd_avx2(auVar58,auVar50);
  auVar50 = vpsubd_avx2(auVar58,auVar50);
  auVar23 = vpmaxsd_avx2(auVar23,auVar55);
  alVar5 = (__m256i)vpminsd_avx2(auVar23,auVar54);
  auVar23 = vpmaxsd_avx2(auVar50,auVar55);
  alVar6 = (__m256i)vpminsd_avx2(auVar23,auVar54);
  out[3] = alVar5;
  out[0x1c] = alVar6;
  auVar23 = vpmaxsd_avx2(auVar55,auVar41);
  auVar50 = vpminsd_avx2(auVar23,auVar54);
  auVar23 = vpaddd_avx2(auVar53,auVar50);
  auVar50 = vpsubd_avx2(auVar50,auVar53);
  auVar23 = vpmaxsd_avx2(auVar23,auVar55);
  alVar6 = (__m256i)vpminsd_avx2(auVar23,auVar54);
  auVar23 = vpmaxsd_avx2(auVar50,auVar55);
  alVar7 = (__m256i)vpminsd_avx2(auVar23,auVar54);
  out[4] = alVar6;
  out[0x1b] = alVar7;
  auVar23 = vpmaxsd_avx2(auVar55,auVar42);
  auVar50 = vpminsd_avx2(auVar23,auVar54);
  auVar23 = vpaddd_avx2(auVar52,auVar50);
  auVar50 = vpsubd_avx2(auVar50,auVar52);
  auVar23 = vpmaxsd_avx2(auVar23,auVar55);
  alVar7 = (__m256i)vpminsd_avx2(auVar23,auVar54);
  auVar23 = vpmaxsd_avx2(auVar50,auVar55);
  alVar8 = (__m256i)vpminsd_avx2(auVar23,auVar54);
  out[5] = alVar7;
  out[0x1a] = alVar8;
  auVar23 = vpmaxsd_avx2(auVar55,auVar39);
  auVar50 = vpminsd_avx2(auVar23,auVar54);
  auVar23 = vpaddd_avx2(auVar43,auVar50);
  auVar39 = vpsubd_avx2(auVar50,auVar43);
  auVar50 = vpmaxsd_avx2(auVar55,auVar38);
  auVar58 = vpminsd_avx2(auVar50,auVar54);
  auVar50 = vpaddd_avx2(auVar61,auVar58);
  auVar40 = vpsubd_avx2(auVar58,auVar61);
  auVar58 = vpmaxsd_avx2(auVar55,auVar62);
  auVar85 = vpminsd_avx2(auVar58,auVar54);
  auVar58 = vpaddd_avx2(auVar57,auVar85);
  auVar41 = vpsubd_avx2(auVar85,auVar57);
  auVar85 = vpmaxsd_avx2(auVar55,auVar74);
  auVar78 = vpminsd_avx2(auVar85,auVar54);
  auVar85 = vpaddd_avx2(auVar68,auVar78);
  auVar42 = vpsubd_avx2(auVar78,auVar68);
  auVar78 = vpmaxsd_avx2(auVar55,auVar75);
  auVar36 = vpminsd_avx2(auVar78,auVar54);
  auVar78 = vpaddd_avx2(auVar65,auVar36);
  auVar51 = vpsubd_avx2(auVar36,auVar65);
  auVar36 = vpmaxsd_avx2(auVar55,auVar46);
  auVar37 = vpminsd_avx2(auVar36,auVar54);
  auVar36 = vpaddd_avx2(auVar64,auVar37);
  auVar52 = vpsubd_avx2(auVar37,auVar64);
  auVar49 = vpmaxsd_avx2(auVar55,auVar49);
  auVar37 = vpminsd_avx2(auVar49,auVar54);
  auVar49 = vpmaxsd_avx2(auVar55,auVar86);
  auVar38 = vpminsd_avx2(auVar49,auVar54);
  auVar49 = vpaddd_avx2(auVar38,auVar37);
  auVar53 = vpsubd_avx2(auVar38,auVar37);
  auVar67 = vpmaxsd_avx2(auVar55,auVar67);
  auVar37 = vpminsd_avx2(auVar67,auVar54);
  auVar67 = vpmaxsd_avx2(auVar55,auVar84);
  auVar38 = vpminsd_avx2(auVar67,auVar54);
  auVar67 = vpaddd_avx2(auVar38,auVar37);
  auVar57 = vpsubd_avx2(auVar38,auVar37);
  auVar77 = vpmaxsd_avx2(auVar55,auVar77);
  auVar37 = vpminsd_avx2(auVar77,auVar54);
  auVar77 = vpmaxsd_avx2(auVar55,auVar82);
  auVar38 = vpminsd_avx2(auVar77,auVar54);
  auVar77 = vpaddd_avx2(auVar38,auVar37);
  auVar61 = vpsubd_avx2(auVar38,auVar37);
  auVar80 = vpmaxsd_avx2(auVar55,auVar80);
  auVar37 = vpminsd_avx2(auVar80,auVar54);
  auVar80 = vpmaxsd_avx2(auVar55,auVar81);
  auVar38 = vpminsd_avx2(auVar80,auVar54);
  auVar80 = vpaddd_avx2(auVar38,auVar37);
  auVar43 = vpsubd_avx2(auVar38,auVar37);
  auVar23 = vpmaxsd_avx2(auVar23,auVar55);
  auVar37 = vpmaxsd_avx2(auVar39,auVar55);
  auVar50 = vpmaxsd_avx2(auVar50,auVar55);
  auVar38 = vpmaxsd_avx2(auVar40,auVar55);
  auVar58 = vpmaxsd_avx2(auVar58,auVar55);
  auVar39 = vpmaxsd_avx2(auVar41,auVar55);
  auVar85 = vpmaxsd_avx2(auVar85,auVar55);
  auVar40 = vpmaxsd_avx2(auVar42,auVar55);
  auVar78 = vpmaxsd_avx2(auVar55,auVar78);
  auVar41 = vpmaxsd_avx2(auVar55,auVar51);
  auVar36 = vpmaxsd_avx2(auVar55,auVar36);
  auVar42 = vpmaxsd_avx2(auVar55,auVar52);
  auVar49 = vpmaxsd_avx2(auVar55,auVar49);
  auVar51 = vpmaxsd_avx2(auVar55,auVar53);
  auVar67 = vpmaxsd_avx2(auVar55,auVar67);
  auVar52 = vpmaxsd_avx2(auVar55,auVar57);
  auVar77 = vpmaxsd_avx2(auVar55,auVar77);
  auVar53 = vpmaxsd_avx2(auVar55,auVar61);
  auVar80 = vpmaxsd_avx2(auVar80,auVar55);
  auVar57 = vpmaxsd_avx2(auVar43,auVar55);
  auVar23 = vpminsd_avx2(auVar23,auVar54);
  alVar8 = (__m256i)vpminsd_avx2(auVar54,auVar37);
  auVar50 = vpminsd_avx2(auVar50,auVar54);
  alVar9 = (__m256i)vpminsd_avx2(auVar38,auVar54);
  alVar10 = (__m256i)vpminsd_avx2(auVar58,auVar54);
  auVar58 = vpminsd_avx2(auVar39,auVar54);
  auVar85 = vpminsd_avx2(auVar85,auVar54);
  auVar37 = vpminsd_avx2(auVar40,auVar54);
  alVar11 = (__m256i)vpminsd_avx2(auVar78,auVar54);
  alVar12 = (__m256i)vpminsd_avx2(auVar41,auVar54);
  alVar13 = (__m256i)vpminsd_avx2(auVar36,auVar54);
  alVar14 = (__m256i)vpminsd_avx2(auVar42,auVar54);
  alVar15 = (__m256i)vpminsd_avx2(auVar54,auVar49);
  alVar16 = (__m256i)vpminsd_avx2(auVar54,auVar51);
  alVar17 = (__m256i)vpminsd_avx2(auVar54,auVar67);
  alVar18 = (__m256i)vpminsd_avx2(auVar54,auVar52);
  alVar19 = (__m256i)vpminsd_avx2(auVar54,auVar77);
  alVar20 = (__m256i)vpminsd_avx2(auVar54,auVar53);
  alVar21 = (__m256i)vpminsd_avx2(auVar54,auVar80);
  alVar22 = (__m256i)vpminsd_avx2(auVar54,auVar57);
  local_500 = auVar23._0_8_;
  lStack_4f8 = auVar23._8_8_;
  lStack_4f0 = auVar23._16_8_;
  lStack_4e8 = auVar23._24_8_;
  out[6][0] = local_500;
  out[6][1] = lStack_4f8;
  out[6][2] = lStack_4f0;
  out[6][3] = lStack_4e8;
  local_520 = auVar50._0_8_;
  lStack_518 = auVar50._8_8_;
  lStack_510 = auVar50._16_8_;
  lStack_508 = auVar50._24_8_;
  out[0x19] = alVar8;
  out[7][0] = local_520;
  out[7][1] = lStack_518;
  out[7][2] = lStack_510;
  out[7][3] = lStack_508;
  out[0x18] = alVar9;
  out[8] = alVar10;
  local_540 = auVar58._0_8_;
  lStack_538 = auVar58._8_8_;
  lStack_530 = auVar58._16_8_;
  lStack_528 = auVar58._24_8_;
  out[0x17][0] = local_540;
  out[0x17][1] = lStack_538;
  out[0x17][2] = lStack_530;
  out[0x17][3] = lStack_528;
  local_4e0 = auVar85._0_8_;
  lStack_4d8 = auVar85._8_8_;
  lStack_4d0 = auVar85._16_8_;
  lStack_4c8 = auVar85._24_8_;
  out[9][0] = local_4e0;
  out[9][1] = lStack_4d8;
  out[9][2] = lStack_4d0;
  out[9][3] = lStack_4c8;
  local_3a0 = auVar37._0_8_;
  lStack_398 = auVar37._8_8_;
  lStack_390 = auVar37._16_8_;
  lStack_388 = auVar37._24_8_;
  out[0x16][0] = local_3a0;
  out[0x16][1] = lStack_398;
  out[0x16][2] = lStack_390;
  out[0x16][3] = lStack_388;
  out[10] = alVar11;
  out[0x15] = alVar12;
  out[0xb] = alVar13;
  out[0x14] = alVar14;
  out[0xc] = alVar15;
  out[0x13] = alVar16;
  out[0xd] = alVar17;
  out[0x12] = alVar18;
  out[0xe] = alVar19;
  out[0x11] = alVar20;
  out[0xf] = alVar21;
  out[0x10] = alVar22;
  if (do_cols == 0) {
    bVar29 = 10;
    if (10 < bd) {
      bVar29 = (byte)bd;
    }
    local_a0 = 0x20 << (bVar29 & 0x1f);
    local_80 = -local_a0;
    local_a0 = local_a0 + -1;
    if (out_shift != 0) {
      iVar34 = 1 << ((char)out_shift - 1U & 0x1f);
      auVar89._4_4_ = iVar34;
      auVar89._0_4_ = iVar34;
      auVar89._8_4_ = iVar34;
      auVar89._12_4_ = iVar34;
      auVar89._16_4_ = iVar34;
      auVar89._20_4_ = iVar34;
      auVar89._24_4_ = iVar34;
      auVar89._28_4_ = iVar34;
      auVar80 = vpaddd_avx2(auVar89,(undefined1  [32])alVar2);
      auVar77 = vpaddd_avx2(auVar89,(undefined1  [32])alVar3);
      alVar2 = (__m256i)vpsrad_avx2(auVar80,ZEXT416((uint)out_shift));
      alVar3 = (__m256i)vpsrad_avx2(auVar77,ZEXT416((uint)out_shift));
      *out = alVar2;
      out[1] = alVar3;
      auVar80 = vpaddd_avx2(auVar89,(undefined1  [32])alVar4);
      auVar77 = vpaddd_avx2(auVar89,(undefined1  [32])alVar5);
      auVar56 = ZEXT416((uint)out_shift);
      alVar2 = (__m256i)vpsrad_avx2(auVar80,auVar56);
      alVar3 = (__m256i)vpsrad_avx2(auVar77,auVar56);
      out[2] = alVar2;
      out[3] = alVar3;
      auVar80 = vpaddd_avx2(auVar89,(undefined1  [32])alVar6);
      auVar77 = vpaddd_avx2(auVar89,(undefined1  [32])alVar7);
      alVar2 = (__m256i)vpsrad_avx2(auVar80,auVar56);
      alVar3 = (__m256i)vpsrad_avx2(auVar77,auVar56);
      out[4] = alVar2;
      out[5] = alVar3;
      auVar23 = vpaddd_avx2(auVar89,auVar23);
      auVar80 = vpaddd_avx2(auVar89,auVar50);
      auVar56 = ZEXT416((uint)out_shift);
      alVar2 = (__m256i)vpsrad_avx2(auVar23,auVar56);
      alVar3 = (__m256i)vpsrad_avx2(auVar80,auVar56);
      out[6] = alVar2;
      out[7] = alVar3;
      auVar23 = vpaddd_avx2(auVar89,(undefined1  [32])alVar10);
      auVar80 = vpaddd_avx2(auVar89,auVar85);
      alVar2 = (__m256i)vpsrad_avx2(auVar23,auVar56);
      alVar3 = (__m256i)vpsrad_avx2(auVar80,auVar56);
      out[8] = alVar2;
      out[9] = alVar3;
      auVar23 = vpaddd_avx2(auVar89,(undefined1  [32])alVar11);
      auVar80 = vpaddd_avx2((undefined1  [32])alVar13,auVar89);
      alVar2 = (__m256i)vpsrad_avx2(auVar23,auVar56);
      alVar3 = (__m256i)vpsrad_avx2(auVar80,auVar56);
      out[10] = alVar2;
      out[0xb] = alVar3;
      auVar23 = vpaddd_avx2(auVar89,(undefined1  [32])alVar15);
      auVar80 = vpaddd_avx2((undefined1  [32])alVar17,auVar89);
      alVar2 = (__m256i)vpsrad_avx2(auVar23,auVar56);
      alVar3 = (__m256i)vpsrad_avx2(auVar80,auVar56);
      out[0xc] = alVar2;
      out[0xd] = alVar3;
      auVar23 = vpaddd_avx2((undefined1  [32])alVar19,auVar89);
      auVar80 = vpaddd_avx2((undefined1  [32])alVar21,auVar89);
      auVar56 = ZEXT416((uint)out_shift);
      alVar2 = (__m256i)vpsrad_avx2(auVar23,auVar56);
      alVar3 = (__m256i)vpsrad_avx2(auVar80,auVar56);
      out[0xe] = alVar2;
      out[0xf] = alVar3;
      auVar23 = vpaddd_avx2((undefined1  [32])alVar22,auVar89);
      auVar80 = vpaddd_avx2(auVar89,(undefined1  [32])alVar20);
      alVar2 = (__m256i)vpsrad_avx2(auVar23,auVar56);
      alVar3 = (__m256i)vpsrad_avx2(auVar80,auVar56);
      out[0x10] = alVar2;
      out[0x11] = alVar3;
      auVar23 = vpaddd_avx2(auVar89,(undefined1  [32])alVar18);
      auVar80 = vpaddd_avx2(auVar89,(undefined1  [32])alVar16);
      alVar2 = (__m256i)vpsrad_avx2(auVar23,auVar56);
      alVar3 = (__m256i)vpsrad_avx2(auVar80,auVar56);
      out[0x12] = alVar2;
      out[0x13] = alVar3;
      auVar23 = vpaddd_avx2(auVar89,(undefined1  [32])alVar14);
      auVar80 = vpaddd_avx2((undefined1  [32])alVar12,auVar89);
      alVar2 = (__m256i)vpsrad_avx2(auVar23,auVar56);
      alVar3 = (__m256i)vpsrad_avx2(auVar80,auVar56);
      out[0x14] = alVar2;
      out[0x15] = alVar3;
      auVar23 = vpaddd_avx2(auVar89,auVar37);
      auVar80 = vpaddd_avx2(auVar89,auVar58);
      alVar2 = (__m256i)vpsrad_avx2(auVar23,auVar56);
      alVar3 = (__m256i)vpsrad_avx2(auVar80,auVar56);
      out[0x16] = alVar2;
      out[0x17] = alVar3;
      auVar23 = vpaddd_avx2(auVar89,(undefined1  [32])alVar9);
      auVar80 = vpaddd_avx2(auVar89,(undefined1  [32])alVar8);
      auVar77 = vpaddd_avx2(auVar89,(undefined1  [32])out[0x1a]);
      auVar67 = vpaddd_avx2(auVar89,(undefined1  [32])out[0x1b]);
      alVar2 = (__m256i)vpsrad_avx2(auVar23,auVar56);
      alVar3 = (__m256i)vpsrad_avx2(auVar80,auVar56);
      out[0x18] = alVar2;
      out[0x19] = alVar3;
      alVar2 = (__m256i)vpsrad_avx2(auVar77,auVar56);
      out[0x1a] = alVar2;
      alVar2 = (__m256i)vpsrad_avx2(auVar67,auVar56);
      out[0x1b] = alVar2;
      auVar23 = vpaddd_avx2(auVar89,(undefined1  [32])out[0x1c]);
      auVar80 = vpaddd_avx2(auVar89,(undefined1  [32])out[0x1d]);
      auVar77 = vpaddd_avx2(auVar89,(undefined1  [32])out[0x1e]);
      auVar67 = vpaddd_avx2(auVar89,(undefined1  [32])out[0x1f]);
      alVar2 = (__m256i)vpsrad_avx2(auVar23,auVar56);
      alVar3 = (__m256i)vpsrad_avx2(auVar80,auVar56);
      out[0x1c] = alVar2;
      out[0x1d] = alVar3;
      alVar2 = (__m256i)vpsrad_avx2(auVar77,ZEXT416((uint)out_shift));
      out[0x1e] = alVar2;
      alVar2 = (__m256i)vpsrad_avx2(auVar67,ZEXT416((uint)out_shift));
      out[0x1f] = alVar2;
    }
    iStack_9c = local_a0;
    iStack_98 = local_a0;
    iStack_94 = local_a0;
    iStack_90 = local_a0;
    iStack_8c = local_a0;
    iStack_88 = local_a0;
    iStack_84 = local_a0;
    iStack_7c = local_80;
    iStack_78 = local_80;
    iStack_74 = local_80;
    iStack_70 = local_80;
    iStack_6c = local_80;
    iStack_68 = local_80;
    iStack_64 = local_80;
    highbd_clamp_epi32_avx2(out,out,(__m256i *)&local_80,(__m256i *)&local_a0,0x20);
  }
  return;
}

Assistant:

static void idct32_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  __m256i cospi_p62_m02 = pair_set_w16_epi16(cospi[62], -cospi[2]);
  __m256i cospi_p02_p62 = pair_set_w16_epi16(cospi[2], cospi[62]);
  __m256i cospi_p30_m34 = pair_set_w16_epi16(cospi[30], -cospi[34]);
  __m256i cospi_p34_p30 = pair_set_w16_epi16(cospi[34], cospi[30]);
  __m256i cospi_p46_m18 = pair_set_w16_epi16(cospi[46], -cospi[18]);
  __m256i cospi_p18_p46 = pair_set_w16_epi16(cospi[18], cospi[46]);
  __m256i cospi_p14_m50 = pair_set_w16_epi16(cospi[14], -cospi[50]);
  __m256i cospi_p50_p14 = pair_set_w16_epi16(cospi[50], cospi[14]);
  __m256i cospi_p54_m10 = pair_set_w16_epi16(cospi[54], -cospi[10]);
  __m256i cospi_p10_p54 = pair_set_w16_epi16(cospi[10], cospi[54]);
  __m256i cospi_p22_m42 = pair_set_w16_epi16(cospi[22], -cospi[42]);
  __m256i cospi_p42_p22 = pair_set_w16_epi16(cospi[42], cospi[22]);
  __m256i cospi_p38_m26 = pair_set_w16_epi16(cospi[38], -cospi[26]);
  __m256i cospi_p26_p38 = pair_set_w16_epi16(cospi[26], cospi[38]);
  __m256i cospi_p06_m58 = pair_set_w16_epi16(cospi[6], -cospi[58]);
  __m256i cospi_p58_p06 = pair_set_w16_epi16(cospi[58], cospi[6]);
  __m256i cospi_p60_m04 = pair_set_w16_epi16(cospi[60], -cospi[4]);
  __m256i cospi_p04_p60 = pair_set_w16_epi16(cospi[4], cospi[60]);
  __m256i cospi_p28_m36 = pair_set_w16_epi16(cospi[28], -cospi[36]);
  __m256i cospi_p36_p28 = pair_set_w16_epi16(cospi[36], cospi[28]);
  __m256i cospi_p44_m20 = pair_set_w16_epi16(cospi[44], -cospi[20]);
  __m256i cospi_p20_p44 = pair_set_w16_epi16(cospi[20], cospi[44]);
  __m256i cospi_p12_m52 = pair_set_w16_epi16(cospi[12], -cospi[52]);
  __m256i cospi_p52_p12 = pair_set_w16_epi16(cospi[52], cospi[12]);
  __m256i cospi_p56_m08 = pair_set_w16_epi16(cospi[56], -cospi[8]);
  __m256i cospi_p08_p56 = pair_set_w16_epi16(cospi[8], cospi[56]);
  __m256i cospi_p24_m40 = pair_set_w16_epi16(cospi[24], -cospi[40]);
  __m256i cospi_p40_p24 = pair_set_w16_epi16(cospi[40], cospi[24]);
  __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  __m256i cospi_p32_m32 = pair_set_w16_epi16(cospi[32], -cospi[32]);
  __m256i cospi_p48_m16 = pair_set_w16_epi16(cospi[48], -cospi[16]);
  __m256i cospi_p16_p48 = pair_set_w16_epi16(cospi[16], cospi[48]);

  // stage 1
  __m256i x1[32];
  x1[0] = input[0];
  x1[1] = input[16];
  x1[2] = input[8];
  x1[3] = input[24];
  x1[4] = input[4];
  x1[5] = input[20];
  x1[6] = input[12];
  x1[7] = input[28];
  x1[8] = input[2];
  x1[9] = input[18];
  x1[10] = input[10];
  x1[11] = input[26];
  x1[12] = input[6];
  x1[13] = input[22];
  x1[14] = input[14];
  x1[15] = input[30];
  x1[16] = input[1];
  x1[17] = input[17];
  x1[18] = input[9];
  x1[19] = input[25];
  x1[20] = input[5];
  x1[21] = input[21];
  x1[22] = input[13];
  x1[23] = input[29];
  x1[24] = input[3];
  x1[25] = input[19];
  x1[26] = input[11];
  x1[27] = input[27];
  x1[28] = input[7];
  x1[29] = input[23];
  x1[30] = input[15];
  x1[31] = input[31];

  // stage 2
  btf_16_w16_avx2(cospi_p62_m02, cospi_p02_p62, &x1[16], &x1[31], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p30_m34, cospi_p34_p30, &x1[17], &x1[30], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p46_m18, cospi_p18_p46, &x1[18], &x1[29], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p14_m50, cospi_p50_p14, &x1[19], &x1[28], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p54_m10, cospi_p10_p54, &x1[20], &x1[27], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p22_m42, cospi_p42_p22, &x1[21], &x1[26], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p38_m26, cospi_p26_p38, &x1[22], &x1[25], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p06_m58, cospi_p58_p06, &x1[23], &x1[24], _r,
                  INV_COS_BIT);

  // stage 3
  btf_16_w16_avx2(cospi_p60_m04, cospi_p04_p60, &x1[8], &x1[15], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p28_m36, cospi_p36_p28, &x1[9], &x1[14], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p44_m20, cospi_p20_p44, &x1[10], &x1[13], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p12_m52, cospi_p52_p12, &x1[11], &x1[12], _r,
                  INV_COS_BIT);
  idct32_high16_stage3_avx2(x1);

  // stage 4
  btf_16_w16_avx2(cospi_p56_m08, cospi_p08_p56, &x1[4], &x1[7], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p24_m40, cospi_p40_p24, &x1[5], &x1[6], _r,
                  INV_COS_BIT);
  btf_16_adds_subs_avx2(&x1[8], &x1[9]);
  btf_16_adds_subs_avx2(&x1[11], &x1[10]);
  btf_16_adds_subs_avx2(&x1[12], &x1[13]);
  btf_16_adds_subs_avx2(&x1[15], &x1[14]);
  idct32_high16_stage4_avx2(x1, cospi, _r, INV_COS_BIT);

  // stage 5
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[0], &x1[1], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p48_m16, cospi_p16_p48, &x1[2], &x1[3], _r,
                  INV_COS_BIT);
  btf_16_adds_subs_avx2(&x1[4], &x1[5]);
  btf_16_adds_subs_avx2(&x1[7], &x1[6]);
  idct32_high24_stage5_avx2(x1, cospi, _r, INV_COS_BIT);

  // stage 6
  btf_16_adds_subs_avx2(&x1[0], &x1[3]);
  btf_16_adds_subs_avx2(&x1[1], &x1[2]);
  idct32_high28_stage6_avx2(x1, cospi, _r, INV_COS_BIT);

  idct32_stage7_avx2(x1, cospi, _r, INV_COS_BIT);
  idct32_stage8_avx2(x1, cospi, _r, INV_COS_BIT);
  idct32_stage9_avx2(output, x1);
}